

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CShInstruction.cpp
# Opt level: O0

void __thiscall CShInstruction::Encode(CShInstruction *this)

{
  uint16_t local_12;
  uint16_t encoding;
  CShInstruction *this_local;
  
  local_12 = (this->opcodeData).opcode.base;
  switch((this->opcodeData).opcode.format) {
  case 0:
    break;
  case 1:
    local_12 = local_12 | (ushort)(((this->registerData).grt.num & 0xfU) << 8);
    break;
  case 2:
    local_12 = local_12 | (ushort)(((this->registerData).grs.num & 0xfU) << 8);
    break;
  case 3:
    local_12 = local_12 | (ushort)(((this->registerData).grt.num & 0xfU) << 8) |
               (ushort)(((this->registerData).grs.num & 0xfU) << 4);
    break;
  case 4:
    local_12 = local_12 | (ushort)(((this->registerData).grs.num & 0xfU) << 4) |
               (ushort)(this->immediateData).primary.value;
    break;
  case 5:
    local_12 = local_12 | (ushort)(((this->registerData).grt.num & 0xfU) << 4) |
               (ushort)(this->immediateData).primary.value;
    break;
  case 6:
    local_12 = local_12 | (ushort)(((this->registerData).grt.num & 0xfU) << 8) |
               (ushort)(((this->registerData).grs.num & 0xfU) << 4) |
               (ushort)(this->immediateData).primary.value;
    break;
  case 7:
  case 8:
    local_12 = local_12 | (ushort)(this->immediateData).primary.value;
    break;
  case 9:
    local_12 = local_12 | (ushort)(((this->registerData).grt.num & 0xfU) << 8) |
               (ushort)(this->immediateData).primary.value;
    break;
  case 10:
    local_12 = local_12 | (ushort)(this->immediateData).primary.value;
    break;
  case 0xb:
    local_12 = local_12 | (ushort)(((this->registerData).grt.num & 0xfU) << 8) |
               (ushort)(this->immediateData).primary.value;
  }
  FileManager::writeU16(g_fileManager,local_12);
  return;
}

Assistant:

void CShInstruction::Encode() const
{
	uint16_t encoding = opcodeData.opcode.base;

	switch (opcodeData.opcode.format)
	{
	case SHFMT_0:     // xxxx xxxx xxxx xxxx
		break;
	case SHFMT_N:     // xxxx nnnn xxxx xxxx
		encoding |= (registerData.grt.num & 0xF) << 8;
		break;
	case SHFMT_M:     // xxxx mmmm xxxx xxxx
		encoding |= (registerData.grs.num & 0xF) << 8;
		break;
	case SHFMT_NM:    // xxxx nnnn mmmm xxxx
		encoding |= (registerData.grt.num & 0xF) << 8;
		encoding |= (registerData.grs.num & 0xF) << 4;
		break;
	case SHFMT_MD:    // xxxx xxxx mmmm dddd
		encoding |= (registerData.grs.num & 0xF) << 4;
		encoding |= immediateData.primary.value;
		break;
	case SHFMT_ND4:   // xxxx xxxx nnnn dddd
		encoding |= (registerData.grt.num & 0xF) << 4;
		encoding |= immediateData.primary.value;
		break;
	case SHFMT_NMD:   // xxxx nnnn mmmm dddd
		encoding |= (registerData.grt.num & 0xF) << 8;
		encoding |= (registerData.grs.num & 0xF) << 4;
		encoding |= immediateData.primary.value;
		break;
	case SHFMT_D:     // xxxx xxxx dddd dddd
	case SHFMT_D12:   // xxxx dddd dddd dddd
		encoding |= immediateData.primary.value;
		break;
	case SHFMT_ND8:   // xxxx nnnn dddd dddd
		encoding |= (registerData.grt.num & 0xF) << 8;
		encoding |= immediateData.primary.value;
		break;
	case SHFMT_I:     // xxxx xxxx iiii iiii
		encoding |= immediateData.primary.value;
		break;
	case SHFMT_NI:    // xxxx nnnn iiii iiii
		encoding |= (registerData.grt.num & 0xF) << 8;
		encoding |= immediateData.primary.value;
		break;
	}

	g_fileManager->writeU16((uint16_t)encoding);
}